

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O0

void anon_unknown.dwarf_6260c::test_reduce_construction<unsigned_long_long>(void)

{
  bool bVar1;
  ResultBuilder *pRVar2;
  ExpressionLhs<const_unsigned_long_long_&> EVar3;
  int local_604;
  value_type_conflict7 local_600;
  ExpressionLhs<const_unsigned_long_long_&> local_5f8;
  SourceLineInfo local_5e8;
  undefined1 local_5c0 [8];
  ResultBuilder __catchResult_1;
  value_type_conflict7 local_318;
  ExpressionLhs<const_unsigned_long_long_&> local_310 [2];
  SourceLineInfo local_2f0;
  undefined1 local_2c8 [8];
  ResultBuilder __catchResult;
  rational r2;
  rational r1;
  
  tcb::rational<unsigned_long_long>::rational
            ((rational<unsigned_long_long> *)&__catchResult.m_shouldDebugBreak,10,100);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x5c);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2c8,"REQUIRE",&local_2f0,"r2.num() == 1",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_2f0);
    local_318 = tcb::rational<unsigned_long_long>::num
                          ((rational<unsigned_long_long> *)&__catchResult.m_shouldDebugBreak);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_2c8,&local_318);
    __catchResult_1._668_4_ = 1;
    local_310[0] = EVar3;
    pRVar2 = Catch::ExpressionLhs<unsigned_long_long_const&>::operator==
                       ((ExpressionLhs<unsigned_long_long_const&> *)local_310,
                        (int *)&__catchResult_1.field_0x29c);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_2c8);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_2c8);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2c8);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_5e8,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x5d);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_5c0,"REQUIRE",&local_5e8,"r2.denom() == 10",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_5e8);
    local_600 = tcb::rational<unsigned_long_long>::denom
                          ((rational<unsigned_long_long> *)&__catchResult.m_shouldDebugBreak);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_5c0,&local_600);
    local_604 = 10;
    local_5f8 = EVar3;
    pRVar2 = Catch::ExpressionLhs<unsigned_long_long_const&>::operator==
                       ((ExpressionLhs<unsigned_long_long_const&> *)&local_5f8,&local_604);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_5c0);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_5c0);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_5c0);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  return;
}

Assistant:

void test_reduce_construction()
{
    using rational = tcb::rational<T>;

#ifdef TCB_HAVE_CONSTEXPR14
    constexpr rational r1{10, 100};
    static_assert(r1.num() == 1, "");
    static_assert(r1.denom() == 10, "");
#endif

    const rational r2{10, 100};
    REQUIRE(r2.num() == 1);
    REQUIRE(r2.denom() == 10);
}